

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuPixelFormat.hpp
# Opt level: O2

RGBA __thiscall tcu::PixelFormat::convertColor(PixelFormat *this,RGBA *col)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  uVar1 = convertChannel((uint)(byte)col->m_value,this->redBits);
  iVar2 = convertChannel((uint)*(byte *)((long)&col->m_value + 1),this->greenBits);
  iVar3 = convertChannel((uint)*(byte *)((long)&col->m_value + 2),this->blueBits);
  if (this->alphaBits == 0) {
    uVar5 = 0xff000000;
  }
  else {
    iVar4 = convertChannel((uint)*(byte *)((long)&col->m_value + 3),this->alphaBits);
    uVar5 = iVar4 << 0x18;
  }
  return (RGBA)(iVar2 << 8 | uVar1 | iVar3 << 0x10 | uVar5);
}

Assistant:

inline RGBA convertColor (const RGBA& col) const
	{
		return RGBA(convertChannel(col.getRed(),	redBits),
					convertChannel(col.getGreen(),	greenBits),
					convertChannel(col.getBlue(),	blueBits),
					alphaBits ? convertChannel(col.getAlpha(), alphaBits) : 0xff);
	}